

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall llvm::cl::AddLiteralOption(cl *this,Option *O,StringRef Name)

{
  uint uVar1;
  atomic<void_*> this_00;
  void **ppvVar2;
  cl *pcVar3;
  StringRef Name_00;
  StringRef Name_01;
  SmallPtrSetIteratorImpl local_50;
  SmallPtrSetIteratorImpl local_40;
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::CommandLineParser>::call,
               object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  this_00._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  if (*(uint *)(this + 100) == *(uint *)(this + 0x68)) {
    if (TopLevelSubCommand == (SubCommand *)0x0) {
      ManagedStaticBase::RegisterManagedStatic
                ((ManagedStaticBase *)&TopLevelSubCommand,object_creator<llvm::cl::SubCommand>::call
                 ,object_deleter<llvm::cl::SubCommand>::call);
    }
    Name_00.Length = (size_t)Name.Data;
    Name_00.Data = (char *)O;
    anon_unknown.dwarf_e80a7::CommandLineParser::addLiteralOption
              ((CommandLineParser *)this_00._M_b._M_p,(Option *)this,TopLevelSubCommand,Name_00);
    return;
  }
  local_40.Bucket = *(void ***)(this + 0x58);
  uVar1 = *(uint *)(this + 100);
  if (local_40.Bucket != *(void ***)(this + 0x50)) {
    uVar1 = *(uint *)(this + 0x60);
  }
  local_40.End = local_40.Bucket + uVar1;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_40);
  local_50.Bucket = local_40.Bucket;
  local_50.End = local_40.End;
  pcVar3 = this + 100;
  if (*(long *)(this + 0x58) != *(long *)(this + 0x50)) {
    pcVar3 = this + 0x60;
  }
  local_40.Bucket = (void **)(*(long *)(this + 0x58) + (ulong)*(uint *)pcVar3 * 8);
  local_40.End = local_40.Bucket;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_40);
  ppvVar2 = local_40.Bucket;
  if (local_50.Bucket != local_40.Bucket) {
    do {
      if (local_50.End <= local_50.Bucket) {
        __assert_fail("Bucket < End",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                      ,0x122,
                      "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                     );
      }
      Name_01.Length = (size_t)Name.Data;
      Name_01.Data = (char *)O;
      anon_unknown.dwarf_e80a7::CommandLineParser::addLiteralOption
                ((CommandLineParser *)this_00._M_b._M_p,(Option *)this,
                 (SubCommand *)*local_50.Bucket,Name_01);
      local_50.Bucket = local_50.Bucket + 1;
      SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_50);
    } while (local_50.Bucket != ppvVar2);
  }
  return;
}

Assistant:

void cl::AddLiteralOption(Option &O, StringRef Name) {
  GlobalParser->addLiteralOption(O, Name);
}